

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::RerouteFilterOperation::~RerouteFilterOperation(RerouteFilterOperation *this)

{
  FilterOperations *in_RDI;
  
  in_RDI->_vptr_FilterOperations = (_func_int **)&PTR__RerouteFilterOperation_00a40b28;
  gmlc::libguarded::
  shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  ::~shared_guarded((shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                     *)0x2d987a);
  gmlc::libguarded::
  atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
  ::~atomic_guarded((atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
                     *)0x2d9888);
  std::shared_ptr<helics::MessageDestOperator>::~shared_ptr
            ((shared_ptr<helics::MessageDestOperator> *)0x2d9896);
  FilterOperations::~FilterOperations(in_RDI);
  return;
}

Assistant:

RerouteFilterOperation::~RerouteFilterOperation() = default;